

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<int_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,double *rhs)

{
  lest *this_00;
  double *in_R8;
  allocator local_d1;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [8];
  undefined8 uStack_b8;
  string local_b0;
  long local_90;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  char *local_68;
  size_type local_60;
  char local_58 [8];
  undefined8 uStack_50;
  undefined1 local_48 [40];
  
  this_00 = *(lest **)this;
  local_90 = -(ulong)((double)*(int *)this_00 != *rhs);
  std::__cxx11::string::string((string *)&local_d0,"!=",&local_d1);
  local_88 = local_78;
  if (local_d0 == local_c0) {
    uStack_70 = uStack_b8;
  }
  else {
    local_88 = local_d0;
  }
  local_80 = local_c8;
  local_c8 = 0;
  local_c0[0] = 0;
  local_d0 = local_c0;
  to_string<int,double>(&local_b0,this_00,(int *)&local_88,(string *)rhs,in_R8);
  local_60 = local_b0._M_string_length;
  local_48[0] = (bool)((byte)local_90 & 1);
  local_68 = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    uStack_50 = local_b0.field_2._8_8_;
  }
  else {
    local_68 = local_b0._M_dataplus._M_p;
  }
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::string((string *)(local_48 + 8),(string *)&local_68);
  result::result(__return_storage_ptr__,(result *)local_48);
  std::__cxx11::string::~string((string *)(local_48 + 8));
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_d0);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }